

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsAutoTableElement.cpp
# Opt level: O0

void __thiscall
FillCellHelper::insertDecoration(FillCellHelper *this,ReportBuilder *builder,QTextDocument *textDoc)

{
  byte bVar1;
  int a;
  TextDocumentData *this_00;
  QVariant local_110;
  undefined1 local_f0 [14];
  QChar local_e2;
  QArrayDataPointer<char16_t> local_e0;
  QString local_c8;
  undefined1 local_b0 [8];
  QString name;
  QPixmap local_90 [24];
  QImage local_78 [40];
  undefined1 local_50 [8];
  QImage img;
  QTextDocument *textDoc_local;
  ReportBuilder *builder_local;
  FillCellHelper *this_local;
  char16_t *str;
  
  qvariant_cast<QImage>((QVariant *)local_50);
  bVar1 = QImage::isNull();
  if ((bVar1 & 1) != 0) {
    qvariant_cast<QIcon>((QVariant *)&name.d.size);
    QIcon::pixmap((QSize *)local_90,(int)&name + 0x10,(State)this);
    QPixmap::toImage();
    QImage::operator=((QImage *)local_50,local_78);
    QImage::~QImage(local_78);
    QPixmap::~QPixmap(local_90);
    QIcon::~QIcon((QIcon *)&name.d.size);
  }
  bVar1 = QImage::isNull();
  if ((bVar1 & 1) == 0) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_e0,(Data *)0x0,L"cell-image%1.png",0x10);
    QString::QString(&local_c8,&local_e0);
    a = insertDecoration::imageNumber + 1;
    insertDecoration::imageNumber = a;
    QLatin1Char::QLatin1Char((QLatin1Char *)(local_f0 + 0xd),' ');
    QChar::QChar(&local_e2,(QLatin1Char)local_f0[0xd]);
    QString::arg((QString *)local_b0,&local_c8,a,0,10,local_e2);
    QString::~QString(&local_c8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e0);
    QUrl::QUrl((QUrl *)local_f0,(QString *)local_b0,TolerantMode);
    QImage::operator_cast_to_QVariant(&local_110,(QImage *)local_50);
    QTextDocument::addResource((int)textDoc,(QUrl *)0x2,(QVariant *)local_f0);
    QVariant::~QVariant(&local_110);
    QUrl::~QUrl((QUrl *)local_f0);
    this_00 = KDReports::ReportBuilder::currentDocumentData(builder);
    KDReports::TextDocumentData::addResourceName(this_00,(QString *)local_b0);
    QTextCursor::insertImage((QString *)&this->cellCursor);
    QString::~QString((QString *)local_b0);
  }
  QImage::~QImage((QImage *)local_50);
  return;
}

Assistant:

void FillCellHelper::insertDecoration(KDReports::ReportBuilder &builder, QTextDocument &textDoc)
{
    QImage img = qvariant_cast<QImage>(cellDecoration);
    if (img.isNull()) {
        img = qvariant_cast<QIcon>(cellDecoration).pixmap(iconSize).toImage();
    }
    if (!img.isNull()) {
        static int imageNumber = 0;
        const QString name = QStringLiteral("cell-image%1.png").arg(++imageNumber);
        textDoc.addResource(QTextDocument::ImageResource, QUrl(name), img);
        builder.currentDocumentData().addResourceName(name);
        cellCursor.insertImage(name);
    }
}